

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

void duckdb::GZipFileSystem::VerifyGZIPHeader
               (uint8_t *gzip_hdr,idx_t read_count,
               optional_ptr<duckdb::CompressedFile,_true> source_file)

{
  IOException *pIVar1;
  string file_info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  optional_ptr<duckdb::CompressedFile,_true> local_28;
  
  local_28.ptr = source_file.ptr;
  if (source_file.ptr == (CompressedFile *)0x0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,anon_var_dwarf_643533f + 9);
  }
  else {
    optional_ptr<duckdb::CompressedFile,_true>::CheckValid(&local_28);
    ::std::operator+(&local_48,": ",&((local_28.ptr)->super_FileHandle).path);
  }
  if (read_count != 10) {
    pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&bStack_68,"Input is not a GZIP stream",&local_48);
    IOException::IOException(pIVar1,&bStack_68);
    __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((*gzip_hdr != '\x1f') || (gzip_hdr[1] != 0x8b)) {
    pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&bStack_68,"Input is not a GZIP stream",&local_48);
    IOException::IOException(pIVar1,&bStack_68);
    __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (gzip_hdr[2] != '\b') {
    pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&bStack_68,"Unsupported GZIP compression method",&local_48);
    IOException::IOException(pIVar1,&bStack_68);
    __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((gzip_hdr[3] & 0x33) == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    return;
  }
  pIVar1 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&bStack_68,"Unsupported GZIP archive",&local_48);
  IOException::IOException(pIVar1,&bStack_68);
  __cxa_throw(pIVar1,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GZipFileSystem::VerifyGZIPHeader(uint8_t gzip_hdr[], idx_t read_count, optional_ptr<CompressedFile> source_file) {
	// include the filename in the error message if known
	string file_info = source_file ? ": " + source_file->path : "";

	// check for incorrectly formatted files
	if (read_count != GZIP_HEADER_MINSIZE) {
		throw IOException("Input is not a GZIP stream" + file_info);
	}
	if (gzip_hdr[0] != 0x1F || gzip_hdr[1] != 0x8B) { // magic header
		throw IOException("Input is not a GZIP stream" + file_info);
	}
	if (gzip_hdr[2] != GZIP_COMPRESSION_DEFLATE) { // compression method
		throw IOException("Unsupported GZIP compression method" + file_info);
	}
	if (gzip_hdr[3] & GZIP_FLAG_UNSUPPORTED) {
		throw IOException("Unsupported GZIP archive" + file_info);
	}
}